

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.h
# Opt level: O2

void fill_CKH_table(map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *t)

{
  mapped_type *pmVar1;
  key_type local_18;
  
  local_18 = 1;
  pmVar1 = std::
           map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](t,&local_18);
  std::__cxx11::string::assign((char *)pmVar1);
  local_18 = 2;
  pmVar1 = std::
           map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](t,&local_18);
  std::__cxx11::string::assign((char *)pmVar1);
  local_18 = 3;
  pmVar1 = std::
           map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](t,&local_18);
  std::__cxx11::string::assign((char *)pmVar1);
  return;
}

Assistant:

void fill_CKH_table(std::map<unsigned long, std::string> &t)
{
	t[CKH_MONOTONIC_COUNTER] = "CKH_MONOTONIC_COUNTER";
	t[CKH_CLOCK] = "CKH_CLOCK";
	t[CKH_USER_INTERFACE] = "CKH_USER_INTERFACE";
}